

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O1

void __thiscall CECorrections::init_members(CECorrections *this)

{
  pointer piVar1;
  pointer pdVar2;
  long *plVar3;
  long *plVar4;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  this->interp_ = false;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"/usr/local/share/cppephem/","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_60);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_30 = *plVar4;
    lStack_28 = plVar3[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar4;
    local_40 = (long *)*plVar3;
  }
  local_38 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->nutation_file_,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  piVar1 = (this->nutation_mjd_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->nutation_mjd_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nutation_mjd_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nutation_mjd_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  pdVar2 = (this->nutation_dut1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->nutation_dut1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nutation_dut1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nutation_dut1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->nutation_xp_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->nutation_xp_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nutation_xp_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nutation_xp_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->nutation_yp_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->nutation_yp_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nutation_yp_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nutation_yp_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->nutation_deps_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->nutation_deps_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nutation_deps_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nutation_deps_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->nutation_dpsi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->nutation_dpsi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nutation_dpsi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nutation_dpsi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"/usr/local/share/cppephem/","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_60);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_30 = *plVar4;
    lStack_28 = plVar3[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar4;
    local_40 = (long *)*plVar3;
  }
  local_38 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->ttut1_file_hist_,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"/usr/local/share/cppephem/","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_60);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_30 = *plVar4;
    lStack_28 = plVar3[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar4;
    local_40 = (long *)*plVar3;
  }
  local_38 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->ttut1_file_pred_,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  pdVar2 = (this->ttut1_mjd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->ttut1_mjd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ttut1_mjd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ttut1_mjd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->ttut1_delt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->ttut1_delt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ttut1_delt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ttut1_delt_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  this->cache_nut_mjd_ = -1e+30;
  this->cache_nut_dut1_ = 0.0;
  this->cache_nut_xp_ = 0.0;
  this->cache_nut_yp_ = 0.0;
  this->cache_nut_deps_ = 0.0;
  this->cache_nut_dpsi_ = 0.0;
  this->cache_ttut1_mjd_ = -1e+30;
  this->cache_ttut1_delt_ = 63.8285;
  return;
}

Assistant:

void CECorrections::init_members(void)
{
    // Note that CECORRFILEPATH is defined at compile time
    interp_ = false;

    nutation_file_ = std::string(CECORRFILEPATH) + "/nutation.txt";
    nutation_mjd_  = std::vector<int>(0);
    nutation_dut1_ = std::vector<double>(0);
    nutation_xp_   = std::vector<double>(0);
    nutation_yp_   = std::vector<double>(0);
    nutation_deps_ = std::vector<double>(0);
    nutation_dpsi_ = std::vector<double>(0);

    ttut1_file_hist_ = std::string(CECORRFILEPATH) + "/ttut1_historic.txt";
    ttut1_file_pred_ = std::string(CECORRFILEPATH) + "/ttut1_predicted.txt";
    ttut1_mjd_       = std::vector<double>(0);
    ttut1_delt_      = std::vector<double>(0); 

    // Nutation cached values
    cache_nut_mjd_  = -1e30;
    cache_nut_dut1_ = 0.0;
    cache_nut_xp_   = 0.0;
    cache_nut_yp_   = 0.0;
    cache_nut_deps_ = 0.0;
    cache_nut_dpsi_ = 0.0;

    // TT-UT1 cached values
    cache_ttut1_mjd_  = -1e30;
    cache_ttut1_delt_ = 63.8285; // Default to J2000 reference date value
}